

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml(string *str,bool is_attribute)

{
  char c;
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  byte in_DL;
  ulong in_RSI;
  string *in_RDI;
  char ch;
  size_t i;
  Message m;
  uchar in_stack_0000014f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  Message *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  Message *in_stack_ffffffffffffffa0;
  ulong local_28;
  
  bVar1 = in_DL & 1;
  Message::Message(in_stack_ffffffffffffffa0);
  for (local_28 = 0; uVar2 = std::__cxx11::string::size(), local_28 < uVar2; local_28 = local_28 + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    c = *pcVar3;
    switch(c) {
    case '\"':
      if (bVar1 == 0) {
        Message::operator<<(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
      }
      else {
        Message::operator<<(in_stack_ffffffffffffff70,(char (*) [7])in_stack_ffffffffffffff68);
      }
      break;
    default:
      in_stack_ffffffffffffff7f = IsValidXmlCharacter('\0');
      if ((bool)in_stack_ffffffffffffff7f) {
        if ((bVar1 == 0) ||
           (in_stack_ffffffffffffff7e = IsNormalizableWhitespace(c),
           !(bool)in_stack_ffffffffffffff7e)) {
          Message::operator<<(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
        }
        else {
          in_stack_ffffffffffffff70 =
               Message::operator<<(in_stack_ffffffffffffff70,(char (*) [4])in_stack_ffffffffffffff68
                                  );
          String::FormatByte_abi_cxx11_(in_stack_0000014f);
          in_stack_ffffffffffffff68 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Message::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          Message::operator<<(in_stack_ffffffffffffff70,(char (*) [2])in_stack_ffffffffffffff68);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
        }
      }
      break;
    case '&':
      Message::operator<<(in_stack_ffffffffffffff70,(char (*) [6])in_stack_ffffffffffffff68);
      break;
    case '\'':
      if (bVar1 == 0) {
        Message::operator<<(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
      }
      else {
        Message::operator<<(in_stack_ffffffffffffff70,(char (*) [7])in_stack_ffffffffffffff68);
      }
      break;
    case '<':
      Message::operator<<(in_stack_ffffffffffffff70,(char (*) [5])in_stack_ffffffffffffff68);
      break;
    case '>':
      Message::operator<<(in_stack_ffffffffffffff70,(char (*) [5])in_stack_ffffffffffffff68);
    }
  }
  Message::GetString_abi_cxx11_
            ((Message *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
  Message::~Message((Message *)0x12a3f4);
  return in_RDI;
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}